

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_lexer.cpp
# Opt level: O2

wstring * get_one_regexp_literal_abi_cxx11_(wstring *__return_storage_ptr__,wstring_view text)

{
  version vVar1;
  wostream *pwVar2;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *pbVar3;
  allocator<wchar_t> local_81;
  wstring_view regex_lit;
  wstring_view text_local;
  lexer l;
  
  text_local._M_str = text._M_str;
  text_local._M_len = text._M_len;
  vVar1 = tested_version();
  mjs::lexer::lexer(&l,&text_local,vVar1);
  regex_lit = mjs::lexer::get_regex_literal(&l);
  if (l.current_token_.type_ == eof) {
    std::__cxx11::wstring::wstring<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,void>
              ((wstring *)__return_storage_ptr__,&regex_lit,&local_81);
    mjs::token::destroy(&l.current_token_);
    return __return_storage_ptr__;
  }
  pwVar2 = std::operator<<((wostream *)&std::wcerr,"get_one_regexp_literal");
  pwVar2 = std::operator<<(pwVar2," in ");
  pwVar2 = std::operator<<(pwVar2,
                           "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                          );
  pwVar2 = std::operator<<(pwVar2,":");
  pwVar2 = (wostream *)std::wostream::operator<<((wostream *)pwVar2,0x8a);
  pwVar2 = std::operator<<(pwVar2,":\n");
  pwVar2 = std::operator<<(pwVar2,"!!(!l.current_token())");
  pwVar2 = std::operator<<(pwVar2," != ");
  pwVar2 = std::operator<<(pwVar2,"true");
  pwVar2 = std::operator<<(pwVar2,"\n");
  pwVar2 = std::wostream::_M_insert<bool>(SUB81(pwVar2,0));
  pwVar2 = std::operator<<(pwVar2," != ");
  pwVar2 = std::wostream::_M_insert<bool>(SUB81(pwVar2,0));
  pwVar2 = std::operator<<(pwVar2,"\n");
  vVar1 = tested_version();
  pbVar3 = mjs::operator<<(pwVar2,vVar1);
  std::operator<<(pbVar3,"\n");
  abort();
}

Assistant:

std::wstring get_one_regexp_literal(std::wstring_view text) {
    lexer l{text, tested_version()};
    const auto regex_lit = l.get_regex_literal();
    REQUIRE(!l.current_token()); // Must be at end
    return std::wstring{regex_lit};
}